

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::RepeatedFieldIteratorTest_ConstIteration_Test::TestBody
          (RepeatedFieldIteratorTest_ConstIteration_Test *this)

{
  bool bVar1;
  RepeatedField<int> *this_00;
  reference piVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_138;
  Message local_130;
  RepeatedIterator<const_int> local_128;
  RepeatedIterator<const_int> local_120;
  int local_114;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_e0;
  Message local_d8;
  iterator local_d0;
  bool local_c1;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_;
  Message local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_2;
  Message local_80;
  RepeatedIterator<const_int> local_78;
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_40;
  int local_34;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  const_iterator iter;
  RepeatedField<int> *const_proto_array;
  RepeatedFieldIteratorTest_ConstIteration_Test *this_local;
  
  this_00 = &(this->super_RepeatedFieldIteratorTest).proto_array_;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )RepeatedField<int>::begin(this_00);
  local_34 = 0;
  piVar2 = internal::RepeatedIterator<const_int>::operator*
                     ((RepeatedIterator<const_int> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_30,"0","*iter",&local_34,piVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(&local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x504,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  internal::RepeatedIterator<const_int>::operator++
            ((RepeatedIterator<const_int> *)&gtest_ar.message_);
  local_6c = 1;
  local_78.it_ = (pointer)internal::RepeatedIterator<const_int>::operator++
                                    ((RepeatedIterator<const_int> *)&gtest_ar.message_,0);
  piVar2 = internal::RepeatedIterator<const_int>::operator*(&local_78);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_68,"1","*iter++",&local_6c,piVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_80);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x506,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_9c = 2;
  piVar2 = internal::RepeatedIterator<const_int>::operator*
                     ((RepeatedIterator<const_int> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_98,"2","*iter",&local_9c,piVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x507,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  internal::RepeatedIterator<const_int>::operator++
            ((RepeatedIterator<const_int> *)&gtest_ar.message_);
  local_d0.it_ = (pointer)RepeatedField<int>::end(this_00);
  local_c1 = internal::operator==(&local_d0,(iterator *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_c0,&local_c1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_c0,
               (AssertionResult *)"const_proto_array.end() == iter","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x509,pcVar3);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  local_114 = 2;
  local_128.it_ = (pointer)RepeatedField<int>::end(this_00);
  local_120.it_ = (pointer)internal::RepeatedIterator<const_int>::operator-(&local_128,1);
  piVar2 = internal::RepeatedIterator<const_int>::operator*(&local_120);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_110,"2","*(const_proto_array.end() - 1)",&local_114,piVar2);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_110);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field_unittest.cc"
               ,0x50a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  return;
}

Assistant:

TEST_F(RepeatedFieldIteratorTest, ConstIteration) {
  const RepeatedField<int>& const_proto_array = proto_array_;
  RepeatedField<int>::const_iterator iter = const_proto_array.begin();
  EXPECT_EQ(0, *iter);
  ++iter;
  EXPECT_EQ(1, *iter++);
  EXPECT_EQ(2, *iter);
  ++iter;
  EXPECT_TRUE(const_proto_array.end() == iter);
  EXPECT_EQ(2, *(const_proto_array.end() - 1));
}